

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<double,ft::allocator<double>>::assign<ft::constDequeIterator<double,32ul>>
          (deque<double,ft::allocator<double>> *this,constDequeIterator<double,_32UL> *first,
          constDequeIterator<double,_32UL> *last,type *param_3)

{
  bool bVar1;
  difference_type dVar2;
  const_reference pvVar3;
  type *in_R8;
  constDequeIterator<double,_32UL> local_178;
  constDequeIterator<double,_32UL> local_150;
  constDequeIterator<double,_32UL> local_128;
  constDequeIterator<double,_32UL> local_100;
  constDequeIterator<double,_32UL> local_d8;
  constDequeIterator<double,_32UL> local_a0;
  constDequeIterator<double,_32UL> local_78;
  undefined1 local_50 [8];
  constDequeIterator<double,_32UL> middle;
  type *param_3_local;
  constDequeIterator<double,_32UL> *last_local;
  constDequeIterator<double,_32UL> *first_local;
  deque<double,_ft::allocator<double>_> *this_local;
  
  middle.super_dequeIterator<double,_32UL>.m_node = (map_pointer)param_3;
  deque<double,_ft::allocator<double>_>::clear((deque<double,_ft::allocator<double>_> *)this);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_78,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_a0,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_d8,last);
  dVar2 = distance<ft::constDequeIterator<double,32ul>>(&local_a0,&local_d8,(type *)0x0);
  next<ft::constDequeIterator<double,32ul>>
            ((constDequeIterator<double,_32UL> *)local_50,(ft *)&local_78,
             (constDequeIterator<double,_32UL> *)(dVar2 / 2),0,in_R8);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_d8);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_a0);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_78);
  while( true ) {
    bVar1 = operator!=((dequeIterator<double,_32UL> *)local_50,
                       &last->super_dequeIterator<double,_32UL>);
    if (!bVar1) break;
    pvVar3 = constDequeIterator<double,_32UL>::operator*
                       ((constDequeIterator<double,_32UL> *)local_50);
    deque<double,_ft::allocator<double>_>::push_back
              ((deque<double,_ft::allocator<double>_> *)this,pvVar3);
    dequeIterator<double,_32UL>::operator++((dequeIterator<double,_32UL> *)local_50);
  }
  constDequeIterator<double,_32UL>::constDequeIterator(&local_128,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_150,first);
  constDequeIterator<double,_32UL>::constDequeIterator(&local_178,last);
  dVar2 = distance<ft::constDequeIterator<double,32ul>>(&local_150,&local_178,(type *)0x0);
  next<ft::constDequeIterator<double,32ul>>
            (&local_100,(ft *)&local_128,(constDequeIterator<double,_32UL> *)(dVar2 / 2),0,in_R8);
  constDequeIterator<double,_32UL>::operator=
            ((constDequeIterator<double,_32UL> *)local_50,&local_100);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_100);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_178);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_150);
  constDequeIterator<double,_32UL>::~constDequeIterator(&local_128);
  while( true ) {
    bVar1 = operator!=((dequeIterator<double,_32UL> *)local_50,
                       &first->super_dequeIterator<double,_32UL>);
    if (!bVar1) break;
    dequeIterator<double,_32UL>::operator--((dequeIterator<double,_32UL> *)local_50);
    pvVar3 = constDequeIterator<double,_32UL>::operator*
                       ((constDequeIterator<double,_32UL> *)local_50);
    deque<double,_ft::allocator<double>_>::push_front
              ((deque<double,_ft::allocator<double>_> *)this,pvVar3);
  }
  constDequeIterator<double,_32UL>::~constDequeIterator
            ((constDequeIterator<double,_32UL> *)local_50);
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}